

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O1

void __thiscall
prometheus::anon_unknown_0::IntegrationTest_shouldDealWithExpiredCollectables_Test::TestBody
          (IntegrationTest_shouldDealWithExpiredCollectables_Test *this)

{
  undefined8 this_00;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  substring;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  substring_00;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_01;
  StringLike<std::__cxx11::basic_string<char>_> *extraout_RDX_02;
  StringLike<std::__cxx11::basic_string<char>_> *extraout_RDX_03;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_04;
  undefined8 *puVar1;
  pointer *__ptr;
  char *pcVar2;
  AssertionResult AVar3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  shared_ptr<prometheus::Registry> disappearing_registry;
  shared_ptr<prometheus::Registry> registry;
  string second_counter_name;
  string first_counter_name;
  Response metrics;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_188;
  undefined8 *local_180;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_178 [16];
  AssertHelper local_168;
  undefined8 *local_160;
  AssertHelper local_158 [2];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  string local_f8;
  string local_d8;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  Response local_78;
  
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_108 + 0x30),"first_total","");
  local_f8._M_dataplus._M_p = local_108 + 0x20;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_108 + 0x10),"second_total","");
  IntegrationTest::RegisterSomeCounter
            ((IntegrationTest *)(local_138 + 0x30),(string *)this,(string *)(local_108 + 0x30));
  IntegrationTest::RegisterSomeCounter
            ((IntegrationTest *)local_138,(string *)this,(string *)(local_108 + 0x10));
  this_00 = local_138._8_8_;
  local_138._0_8_ = (_func_int **)0x0;
  local_138._8_8_ = (GTestFlagSaver *)0x0;
  if ((GTestFlagSaver *)this_00 != (GTestFlagSaver *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  IntegrationTest::FetchMetrics
            (&local_78,&this->super_IntegrationTest,
             &(this->super_IntegrationTest).default_metrics_path_);
  local_158[0].data_._0_4_ = 200;
  AVar3 = testing::internal::CmpHelperEQ<long,int>
                    ((internal *)&local_188,"metrics.code","200",&local_78.code,(int *)local_158);
  puVar1 = local_180;
  substring._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )AVar3.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  if (local_188._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_158);
    if (local_180 == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc"
               ,0xba,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    puVar1 = local_180;
    if (local_158[0].data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_158[0].data_ + 8))();
      puVar1 = local_180;
    }
  }
  else {
    if (local_180 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_180 != local_180 + 2) {
        operator_delete((undefined8 *)*local_180);
      }
      operator_delete(puVar1);
      substring._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           extraout_RDX._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    }
    testing::HasSubstr<std::__cxx11::string>
              (&local_98,(testing *)(local_108 + 0x30),
               (StringLike<std::__cxx11::basic_string<char>_> *)
               substring._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl);
    local_188._M_head_impl = local_178;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_188,local_98.impl_.substring_._M_dataplus._M_p,
               local_98.impl_.substring_._M_dataplus._M_p +
               local_98.impl_.substring_._M_string_length);
    local_158[0].data_ = (AssertHelperData *)local_148;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_158,local_188._M_head_impl,(long)local_180 + local_188._M_head_impl);
    if (local_188._M_head_impl != local_178) {
      operator_delete(local_188._M_head_impl);
    }
    AVar3 = testing::internal::
            PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
            ::operator()(&local_168,(char *)local_158,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x1674e8);
    substring_00._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         AVar3.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    if (local_158[0].data_ != (AssertHelperData *)local_148) {
      operator_delete(local_158[0].data_);
      substring_00 = extraout_RDX_00.
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.impl_.substring_._M_dataplus._M_p != &local_98.impl_.substring_.field_2) {
      operator_delete(local_98.impl_.substring_._M_dataplus._M_p);
      substring_00._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           extraout_RDX_01.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    }
    if ((char)local_168.data_ == '\0') {
      testing::Message::Message((Message *)&local_188);
      if (local_160 == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (char *)*local_160;
      }
      testing::internal::AssertHelper::AssertHelper
                (local_158,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc"
                 ,0xbc,pcVar2);
      testing::internal::AssertHelper::operator=(local_158,(Message *)&local_188);
      testing::internal::AssertHelper::~AssertHelper(local_158);
      substring_00._M_head_impl = extraout_RDX_02;
      if (local_188._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_188._M_head_impl + 8))();
        substring_00._M_head_impl = extraout_RDX_03;
      }
    }
    puVar1 = local_160;
    if (local_160 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_160 != local_160 + 2) {
        operator_delete((undefined8 *)*local_160);
      }
      operator_delete(puVar1);
      substring_00._M_head_impl = extraout_RDX_04._M_head_impl;
    }
    testing::HasSubstr<std::__cxx11::string>
              (&local_b8,(testing *)(local_108 + 0x10),substring_00._M_head_impl);
    local_188._M_head_impl = local_178;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_188,local_b8.impl_.substring_._M_dataplus._M_p,
               local_b8.impl_.substring_._M_dataplus._M_p +
               local_b8.impl_.substring_._M_string_length);
    local_128._0_8_ = local_138 + 0x20;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_138 + 0x10),local_188._M_head_impl,
               (long)local_180 + local_188._M_head_impl);
    if (local_188._M_head_impl != local_178) {
      operator_delete(local_188._M_head_impl);
    }
    local_188._M_head_impl = local_178;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_188,local_128._0_8_,
               (undefined1 *)(local_128._8_8_ + local_128._0_8_));
    local_158[0].data_ = (AssertHelperData *)local_148;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_158,local_188._M_head_impl,(long)local_180 + local_188._M_head_impl);
    if (local_188._M_head_impl != local_178) {
      operator_delete(local_188._M_head_impl);
    }
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::NotMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>
    ::operator()(&local_168,(char *)local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1674e8);
    if (local_158[0].data_ != (AssertHelperData *)local_148) {
      operator_delete(local_158[0].data_);
    }
    if ((undefined1 *)local_128._0_8_ != local_138 + 0x20) {
      operator_delete((void *)local_128._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.impl_.substring_._M_dataplus._M_p != &local_b8.impl_.substring_.field_2) {
      operator_delete(local_b8.impl_.substring_._M_dataplus._M_p);
    }
    puVar1 = local_160;
    if ((char)local_168.data_ == '\0') {
      testing::Message::Message((Message *)&local_188);
      if (local_160 == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (char *)*local_160;
      }
      testing::internal::AssertHelper::AssertHelper
                (local_158,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc"
                 ,0xbd,pcVar2);
      testing::internal::AssertHelper::operator=(local_158,(Message *)&local_188);
      testing::internal::AssertHelper::~AssertHelper(local_158);
      puVar1 = local_160;
      if (local_188._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_188._M_head_impl + 8))();
        puVar1 = local_160;
      }
    }
  }
  if (puVar1 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar1 != puVar1 + 2) {
      operator_delete((undefined8 *)*puVar1);
    }
    operator_delete(puVar1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.contentType._M_dataplus._M_p != &local_78.contentType.field_2) {
    operator_delete(local_78.contentType._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.body._M_dataplus._M_p != &local_78.body.field_2) {
    operator_delete(local_78.body._M_dataplus._M_p);
  }
  if ((GTestFlagSaver *)local_138._8_8_ != (GTestFlagSaver *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
  }
  if (local_f8._M_dataplus._M_p != local_108 + 0x20) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F(IntegrationTest, shouldDealWithExpiredCollectables) {
  const std::string first_counter_name = "first_total";
  const std::string second_counter_name = "second_total";

  const auto registry =
      RegisterSomeCounter(first_counter_name, default_metrics_path_);
  auto disappearing_registry =
      RegisterSomeCounter(second_counter_name, default_metrics_path_);

  disappearing_registry.reset();

  // all set-up

  const auto metrics = FetchMetrics(default_metrics_path_);

  // check results

  ASSERT_EQ(metrics.code, 200);

  EXPECT_THAT(metrics.body, HasSubstr(first_counter_name));
  EXPECT_THAT(metrics.body, Not(HasSubstr(second_counter_name)));
}